

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-history.c
# Opt level: O2

void dump_history(ang_file *file)

{
  int iVar1;
  _Bool _Var2;
  size_t sVar3;
  char *pcVar4;
  long lVar5;
  bool bVar6;
  history_info *history_list_local;
  char buf [120];
  
  history_list_local = (history_info *)0x0;
  sVar3 = history_get_list(player,&history_list_local);
  file_putf(file,"[Player history]\n");
  file_putf(file,"      Turn   Place               Note\n");
  lVar5 = 0;
  while (bVar6 = sVar3 != 0, sVar3 = sVar3 - 1, bVar6) {
    iVar1 = *(int *)(history_list_local->event + lVar5 + -4);
    pcVar4 = level_name(world->levels + *(short *)(history_list_local->type + lVar5 + 2));
    strnfmt(buf,0x78,"%10ld%20s\'  %s",(long)iVar1,pcVar4,history_list_local->event + lVar5);
    _Var2 = flag_has_dbg(history_list_local->type + lVar5,2,4,"history_list_local[i].type",
                         "HIST_ARTIFACT_LOST");
    if (_Var2) {
      my_strcat(buf," (LOST)",0x78);
    }
    file_putf(file,"%s",buf);
    file_put(file,"\n");
    lVar5 = lVar5 + 0x5c;
  }
  return;
}

Assistant:

void dump_history(ang_file *file)
{
	struct history_info *history_list_local = NULL;
	size_t max_item = history_get_list(player, &history_list_local);
	size_t i;
	char buf[120];

	file_putf(file, "[Player history]\n");
	file_putf(file, "      Turn   Place               Note\n");

	for (i = 0; i < max_item; i++) {
		strnfmt(buf, sizeof(buf), "%10ld%20s\'  %s",
				(long)history_list_local[i].turn,
				level_name(&world->levels[history_list_local[i].place]),
				history_list_local[i].event);

		if (hist_has(history_list_local[i].type, HIST_ARTIFACT_LOST))
			my_strcat(buf, " (LOST)", sizeof(buf));

		file_putf(file, "%s", buf);
		file_put(file, "\n");
	}

	return;
}